

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O0

void dump_sequence_fasta(unsigned_long index,FILE *output,long firstSequenceLength,double *d,
                        bool is_prot,unsigned_long from,unsigned_long to)

{
  byte newln;
  char *pcVar1;
  FILE *in_RCX;
  long in_RDX;
  FILE *in_RSI;
  byte in_R8B;
  Vector *in_R9;
  unsigned_long unaff_retaddr;
  FILE *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  FILE *pFVar2;
  
  newln = in_R8B & 1;
  pFVar2 = in_RSI;
  if (in_RCX == (FILE *)0x0) {
    pcVar1 = stringText((StringBuffer *)
                        (CONCAT17(in_R8B,CONCAT16(in_stack_ffffffffffffffde,
                                                  in_stack_ffffffffffffffd8)) & 0x1ffffffffffffff),
                        in_R9,(unsigned_long)in_stack_ffffffffffffffc8);
    fprintf(in_RSI,">%s\n",pcVar1);
  }
  else {
    pcVar1 = stringText((StringBuffer *)
                        (CONCAT17(in_R8B,CONCAT16(in_stack_ffffffffffffffde,
                                                  in_stack_ffffffffffffffd8)) & 0x1ffffffffffffff),
                        in_R9,(unsigned_long)in_RSI);
    fprintf(in_RSI,">%s [%g, %g]\n",*(undefined8 *)in_RCX,*(undefined8 *)(in_RCX + 8),pcVar1);
    in_stack_ffffffffffffffc8 = in_RSI;
  }
  stringText((StringBuffer *)
             CONCAT17(newln,CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),in_R9,
             (unsigned_long)in_stack_ffffffffffffffc8);
  dump_fasta((char *)pFVar2,in_RDX,in_RCX,(bool)newln,(bool)in_stack_ffffffffffffffde,
             (unsigned_long)in_R9,unaff_retaddr);
  return;
}

Assistant:

void dump_sequence_fasta (unsigned long index, FILE* output, long firstSequenceLength, double * d, bool is_prot, unsigned long from, unsigned long to) {
  if (d) {
    fprintf (output, ">%s [%g, %g]\n", stringText (names, nameLengths, index), d[0], d[1]);
  } else {
    fprintf (output, ">%s\n", stringText (names, nameLengths, index));
  }
  
  dump_fasta (stringText (sequences, seqLengths, index), firstSequenceLength, output, true, is_prot, from, to);
}